

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Synth.cpp
# Opt level: O2

void __thiscall
MT32Emu::RendererImpl<float>::doRender(RendererImpl<float> *this,float *stereoStream,Bit32u len)

{
  Bit32u *pBVar1;
  Synth *pSVar2;
  Analog *pAVar3;
  Bit32u len_00;
  int iVar4;
  int iVar5;
  ulong uVar6;
  
  pSVar2 = (this->super_Renderer).synth;
  if (pSVar2->activated != true) {
    pAVar3 = pSVar2->analog;
    iVar4 = (*pAVar3->_vptr_Analog[3])(pAVar3,(ulong)len);
    pSVar2 = (this->super_Renderer).synth;
    pBVar1 = &pSVar2->renderedSampleCount;
    *pBVar1 = *pBVar1 + iVar4;
    pAVar3 = pSVar2->analog;
    iVar4 = (*pAVar3->_vptr_Analog[7])(pAVar3,0,0,0,0,0,0,stereoStream,len);
    if ((char)iVar4 == '\0') {
      Renderer::printDebug
                (&this->super_Renderer,"RendererImpl: Invalid call to Analog::process()!\n");
    }
    Synth::muteSampleBuffer(stereoStream,len * 2);
    Renderer::updateDisplayState(&this->super_Renderer);
    return;
  }
  while( true ) {
    if (len == 0) {
      return;
    }
    uVar6 = 0x1000;
    if (len < 0x1000) {
      uVar6 = (ulong)len;
    }
    pAVar3 = ((this->super_Renderer).synth)->analog;
    iVar5 = (int)uVar6;
    len_00 = (*pAVar3->_vptr_Analog[3])(pAVar3,uVar6);
    doRenderStreams(this,&this->tmpBuffers,len_00);
    pAVar3 = ((this->super_Renderer).synth)->analog;
    iVar4 = (*pAVar3->_vptr_Analog[7])
                      (pAVar3,stereoStream,this->tmpNonReverbLeft,this->tmpNonReverbRight,
                       this->tmpReverbDryLeft,this->tmpReverbDryRight,this->tmpReverbWetLeft,
                       this->tmpReverbWetRight,iVar5);
    if ((char)iVar4 == '\0') break;
    stereoStream = stereoStream + (uint)(iVar5 * 2);
    len = len - iVar5;
  }
  Renderer::printDebug(&this->super_Renderer,"RendererImpl: Invalid call to Analog::process()!\n");
  Synth::muteSampleBuffer(stereoStream,len * 2);
  return;
}

Assistant:

void RendererImpl<Sample>::doRender(Sample *stereoStream, Bit32u len) {
	if (!isActivated()) {
		incRenderedSampleCount(getAnalog().getDACStreamsLength(len));
		if (!getAnalog().process(NULL, NULL, NULL, NULL, NULL, NULL, stereoStream, len)) {
			printDebug("RendererImpl: Invalid call to Analog::process()!\n");
		}
		Synth::muteSampleBuffer(stereoStream, len << 1);
		updateDisplayState();
		return;
	}

	while (len > 0) {
		// As in AnalogOutputMode_ACCURATE mode output is upsampled, MAX_SAMPLES_PER_RUN is more than enough for the temp buffers.
		Bit32u thisPassLen = len > MAX_SAMPLES_PER_RUN ? MAX_SAMPLES_PER_RUN : len;
		doRenderStreams(tmpBuffers, getAnalog().getDACStreamsLength(thisPassLen));
		if (!getAnalog().process(stereoStream, tmpNonReverbLeft, tmpNonReverbRight, tmpReverbDryLeft, tmpReverbDryRight, tmpReverbWetLeft, tmpReverbWetRight, thisPassLen)) {
			printDebug("RendererImpl: Invalid call to Analog::process()!\n");
			Synth::muteSampleBuffer(stereoStream, len << 1);
			return;
		}
		stereoStream += thisPassLen << 1;
		len -= thisPassLen;
	}
}